

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  int _h;
  int *piVar2;
  int iVar3;
  void *__dest;
  int iVar4;
  size_t sVar5;
  long lVar6;
  void *__src;
  char cVar7;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  void *ptr_1;
  int local_18c;
  Mat local_188;
  Mat local_148;
  Option *local_100;
  Mat local_f8;
  Mat local_b8;
  Mat local_78;
  
  _h = bottom_blob->h;
  Mat::create(top_blob,this->num_output << (this->direction == 2),_h,4,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  if (this->direction == 0) {
    local_148.w = (this->weight_xc_data).w;
    local_148.h = (this->weight_xc_data).h;
    local_148.data = (this->weight_xc_data).data;
    sVar5 = (this->weight_xc_data).elemsize;
    local_148.elempack = (this->weight_xc_data).elempack;
    local_148.allocator = (this->weight_xc_data).allocator;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = (undefined4)sVar5;
    local_148.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_148.dims = 2;
    local_148.c = 1;
    local_148.cstep = (size_t)(local_148.h * local_148.w);
    local_188.w = (this->bias_c_data).w;
    local_188.h = (this->bias_c_data).h;
    local_188.data = (this->bias_c_data).data;
    sVar5 = (this->bias_c_data).elemsize;
    local_188.elempack = (this->bias_c_data).elempack;
    local_188.allocator = (this->bias_c_data).allocator;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = (undefined4)sVar5;
    local_188.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_188.dims = 2;
    local_188.c = 1;
    local_188.cstep = (size_t)(local_188.h * local_188.w);
    local_f8.w = (this->weight_hc_data).w;
    local_f8.h = (this->weight_hc_data).h;
    local_f8.data = (this->weight_hc_data).data;
    sVar5 = (this->weight_hc_data).elemsize;
    local_f8.elempack = (this->weight_hc_data).elempack;
    local_f8.allocator = (this->weight_hc_data).allocator;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = (undefined4)sVar5;
    local_f8.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_f8.dims = 2;
    local_f8.c = 1;
    local_f8.cstep = (size_t)(local_f8.h * local_f8.w);
    local_18c = lstm(bottom_blob,top_blob,0,&local_148,&local_188,&local_f8,opt);
    piVar2 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_f8.allocator + 0x18))();
        }
      }
    }
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.c = 0;
    local_f8.cstep = 0;
    piVar2 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (**(code **)(*(long *)local_188.allocator + 0x18))();
        }
      }
    }
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.c = 0;
    local_188.cstep = 0;
    piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (**(code **)(*(long *)local_148.allocator + 0x18))();
        }
      }
    }
    if (local_18c != 0) {
      return local_18c;
    }
  }
  if (this->direction == 1) {
    local_148.w = (this->weight_xc_data).w;
    local_148.h = (this->weight_xc_data).h;
    local_148.data = (this->weight_xc_data).data;
    sVar5 = (this->weight_xc_data).elemsize;
    local_148.elempack = (this->weight_xc_data).elempack;
    local_148.allocator = (this->weight_xc_data).allocator;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = (undefined4)sVar5;
    local_148.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_148.dims = 2;
    local_148.c = 1;
    local_148.cstep = (size_t)(local_148.h * local_148.w);
    local_188.w = (this->bias_c_data).w;
    local_188.h = (this->bias_c_data).h;
    local_188.data = (this->bias_c_data).data;
    sVar5 = (this->bias_c_data).elemsize;
    local_188.elempack = (this->bias_c_data).elempack;
    local_188.allocator = (this->bias_c_data).allocator;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = (undefined4)sVar5;
    local_188.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_188.dims = 2;
    local_188.c = 1;
    local_188.cstep = (size_t)(local_188.h * local_188.w);
    local_f8.w = (this->weight_hc_data).w;
    local_f8.h = (this->weight_hc_data).h;
    local_f8.data = (this->weight_hc_data).data;
    sVar5 = (this->weight_hc_data).elemsize;
    local_f8.elempack = (this->weight_hc_data).elempack;
    local_f8.allocator = (this->weight_hc_data).allocator;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = (undefined4)sVar5;
    local_f8.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_f8.dims = 2;
    local_f8.c = 1;
    local_f8.cstep = (size_t)(local_f8.h * local_f8.w);
    iVar3 = lstm(bottom_blob,top_blob,1,&local_148,&local_188,&local_f8,opt);
    piVar2 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_f8.allocator + 0x18))();
        }
      }
    }
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.c = 0;
    local_f8.cstep = 0;
    piVar2 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (**(code **)(*(long *)local_188.allocator + 0x18))();
        }
      }
    }
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.c = 0;
    local_188.cstep = 0;
    piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (**(code **)(*(long *)local_148.allocator + 0x18))();
        }
      }
    }
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  if (this->direction != 2) {
    return 0;
  }
  local_148.allocator = opt->workspace_allocator;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.refcount = (int *)0x0;
  local_148.elemsize._0_4_ = 4;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 1;
  local_148.w = this->num_output;
  local_148.dims = 2;
  local_148.c = 1;
  iVar3 = this->num_output * _h;
  local_148.cstep = (size_t)iVar3;
  local_100 = opt;
  local_148.h = _h;
  if (iVar3 != 0) {
    lVar6 = local_148.cstep * 4;
    sVar1 = local_148.cstep * 4 + 4;
    if (local_148.allocator == (Allocator *)0x0) {
      local_188.data = (void *)0x0;
      iVar3 = posix_memalign(&local_188.data,0x10,sVar1);
      local_148.data = local_188.data;
      if (iVar3 != 0) {
        local_188.data = (void *)0x0;
        local_148.data = local_188.data;
      }
    }
    else {
      local_148.data =
           (void *)(**(code **)(*(long *)local_148.allocator + 0x10))(local_148.allocator,sVar1);
    }
    local_148.refcount = (int *)((long)local_148.data + lVar6);
    *(undefined4 *)((long)local_148.data + lVar6) = 1;
  }
  iVar3 = -100;
  if ((local_148.data == (void *)0x0) || ((long)local_148.c * local_148.cstep == 0)) {
    cVar7 = '\0';
    goto LAB_0014bedd;
  }
  local_188.allocator = local_100->workspace_allocator;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.refcount = (int *)0x0;
  local_188.elemsize._0_4_ = 4;
  local_188.elemsize._4_4_ = 0;
  local_188.elempack = 1;
  local_188.w = this->num_output;
  local_188.dims = 2;
  local_188.c = 1;
  iVar3 = this->num_output * _h;
  sVar5 = (size_t)iVar3;
  local_188.cstep = sVar5;
  local_188.h = _h;
  if (iVar3 != 0) {
    sVar1 = sVar5 * 4 + 4;
    if (local_188.allocator == (Allocator *)0x0) {
      local_f8.data = (void *)0x0;
      iVar3 = posix_memalign(&local_f8.data,0x10,sVar1);
      local_188.data = local_f8.data;
      if (iVar3 != 0) {
        local_f8.data = (void *)0x0;
        local_188.data = local_f8.data;
      }
    }
    else {
      local_188.data =
           (void *)(**(code **)(*(long *)local_188.allocator + 0x10))(local_188.allocator,sVar1);
    }
    local_188.refcount = (int *)((long)local_188.data + sVar5 * 4);
    *(undefined4 *)((long)local_188.data + sVar5 * 4) = 1;
  }
  iVar3 = -100;
  if ((local_188.data == (void *)0x0) || ((long)local_188.c * local_188.cstep == 0)) {
LAB_0014bc41:
    cVar7 = '\0';
  }
  else {
    local_f8.w = (this->weight_xc_data).w;
    local_f8.h = (this->weight_xc_data).h;
    local_f8.data = (this->weight_xc_data).data;
    sVar5 = (this->weight_xc_data).elemsize;
    local_f8.elempack = (this->weight_xc_data).elempack;
    local_f8.allocator = (this->weight_xc_data).allocator;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = (undefined4)sVar5;
    local_f8.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_f8.dims = 2;
    local_f8.c = 1;
    local_f8.cstep = (size_t)(local_f8.h * local_f8.w);
    local_78.w = (this->bias_c_data).w;
    local_78.h = (this->bias_c_data).h;
    local_78.data = (this->bias_c_data).data;
    sVar5 = (this->bias_c_data).elemsize;
    local_78.elempack = (this->bias_c_data).elempack;
    local_78.allocator = (this->bias_c_data).allocator;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = (undefined4)sVar5;
    local_78.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_78.dims = 2;
    local_78.c = 1;
    local_78.cstep = (size_t)(local_78.h * local_78.w);
    local_b8.w = (this->weight_hc_data).w;
    local_b8.h = (this->weight_hc_data).h;
    local_b8.data = (this->weight_hc_data).data;
    sVar5 = (this->weight_hc_data).elemsize;
    local_b8.elempack = (this->weight_hc_data).elempack;
    local_b8.allocator = (this->weight_hc_data).allocator;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.elemsize._0_4_ = (undefined4)sVar5;
    local_b8.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_b8.dims = 2;
    local_b8.c = 1;
    local_b8.cstep = (size_t)(local_b8.h * local_b8.w);
    iVar3 = lstm(bottom_blob,&local_148,0,&local_f8,&local_78,&local_b8,local_100);
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          if (local_b8.data != (void *)0x0) {
            free(local_b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_b8.allocator + 0x18))();
        }
      }
    }
    local_b8.elemsize._0_4_ = 0;
    local_b8.elemsize._4_4_ = 0;
    local_b8.elempack = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (**(code **)(*(long *)local_78.allocator + 0x18))();
        }
      }
    }
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.c = 0;
    local_78.cstep = 0;
    piVar2 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_f8.allocator + 0x18))();
        }
      }
    }
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.c = 0;
    local_f8.cstep = 0;
    if (iVar3 != 0) goto LAB_0014bc41;
    local_f8.w = (this->weight_xc_data).w;
    local_f8.h = (this->weight_xc_data).h;
    sVar5 = (this->weight_xc_data).elemsize;
    local_f8.data =
         (void *)((this->weight_xc_data).cstep * sVar5 + (long)(this->weight_xc_data).data);
    local_f8.elempack = (this->weight_xc_data).elempack;
    local_f8.allocator = (this->weight_xc_data).allocator;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = (undefined4)sVar5;
    local_f8.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_f8.dims = 2;
    local_f8.c = 1;
    local_f8.cstep = (size_t)(local_f8.h * local_f8.w);
    local_78.w = (this->bias_c_data).w;
    local_78.h = (this->bias_c_data).h;
    sVar5 = (this->bias_c_data).elemsize;
    local_78.data = (void *)((this->bias_c_data).cstep * sVar5 + (long)(this->bias_c_data).data);
    local_78.elempack = (this->bias_c_data).elempack;
    local_78.allocator = (this->bias_c_data).allocator;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = (undefined4)sVar5;
    local_78.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_78.dims = 2;
    local_78.c = 1;
    local_78.cstep = (size_t)(local_78.h * local_78.w);
    local_b8.w = (this->weight_hc_data).w;
    sVar5 = (this->weight_hc_data).elemsize;
    local_b8.data =
         (void *)((this->weight_hc_data).cstep * sVar5 + (long)(this->weight_hc_data).data);
    local_b8.h = (this->weight_hc_data).h;
    iVar4 = (this->weight_hc_data).elempack;
    local_b8.allocator = (this->weight_hc_data).allocator;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.elemsize._0_4_ = (undefined4)sVar5;
    local_b8.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
    local_b8.dims = 2;
    local_b8.c = 1;
    local_b8.cstep = (size_t)(local_b8.h * local_b8.w);
    local_b8.elempack = iVar4;
    iVar3 = lstm(bottom_blob,&local_188,1,&local_f8,&local_78,&local_b8,local_100);
    Mat::~Mat(&local_b8);
    Mat::~Mat(&local_78);
    Mat::~Mat(&local_f8);
    cVar7 = iVar3 == 0;
    if (((bool)cVar7) && (iVar3 = local_18c, 0 < _h)) {
      local_100 = (Option *)CONCAT44(local_100._4_4_,CONCAT31((int3)((uint)iVar4 >> 8),cVar7));
      iVar4 = 0;
      do {
        lVar6 = (long)iVar4;
        __src = (void *)(local_188.w * lVar6 *
                         CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize) +
                        (long)local_188.data);
        __dest = (void *)(top_blob->w * lVar6 * top_blob->elemsize + (long)top_blob->data);
        memcpy(__dest,(void *)(local_148.w * lVar6 *
                               CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) +
                              (long)local_148.data),(long)this->num_output << 2);
        memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,(long)this->num_output << 2
              );
        iVar4 = iVar4 + 1;
      } while (_h != iVar4);
      cVar7 = (char)local_100;
    }
  }
  if (local_188.refcount != (int *)0x0) {
    LOCK();
    *local_188.refcount = *local_188.refcount + -1;
    UNLOCK();
    if (*local_188.refcount == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
          free(local_188.data);
        }
      }
      else {
        (**(code **)(*(long *)local_188.allocator + 0x18))();
      }
    }
  }
  local_188.elemsize._0_4_ = 0;
  local_188.elemsize._4_4_ = 0;
  local_188.elempack = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.c = 0;
  local_188.cstep = 0;
LAB_0014bedd:
  if (local_148.refcount != (int *)0x0) {
    LOCK();
    *local_148.refcount = *local_148.refcount + -1;
    UNLOCK();
    if (*local_148.refcount == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (**(code **)(*(long *)local_148.allocator + 0x18))();
      }
    }
  }
  if (cVar7 != '\0') {
    return 0;
  }
  return iVar3;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // forward
    if (direction == 0)
    {
        int ret = lstm(bottom_blob, top_blob, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, 1, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret0 != 0)
            return ret0;

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i=0; i<T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}